

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O0

Path * FileSystemUtils::operator/(Path *__return_storage_ptr__,Path *lhs_,Path *rhs_)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_4d;
  undefined1 local_40 [8];
  string strlhs;
  Path *rhs__local;
  Path *lhs__local;
  Path *join;
  
  strlhs.field_2._8_8_ = rhs_;
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 0) {
    Path::Path(__return_storage_ptr__,(Path *)strlhs.field_2._8_8_);
  }
  else {
    lVar1 = std::__cxx11::string::length();
    if (lVar1 == 0) {
      Path::Path(__return_storage_ptr__,lhs_);
    }
    else {
      std::__cxx11::string::string((string *)local_40,(string *)&lhs_->m_string);
      while( true ) {
        lVar1 = std::__cxx11::string::length();
        bVar3 = false;
        if (lVar1 != 0) {
          lVar1 = std::__cxx11::string::find_last_of(local_40,0x204e8e);
          lVar2 = std::__cxx11::string::length();
          bVar3 = lVar1 == lVar2 + -1;
        }
        if (!bVar3) break;
        lVar1 = std::__cxx11::string::length();
        std::__cxx11::string::erase((ulong)local_40,lVar1 - 1);
      }
      local_4d = 0;
      std::operator+(&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     '/');
      std::operator+(&local_70,&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (strlhs.field_2._8_8_ + 8));
      Path::Path(__return_storage_ptr__,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      local_4d = 1;
      std::__cxx11::string::~string((string *)local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Path operator/( const Path& lhs_, const Path& rhs_ )
    {
        if( 0 == lhs_.m_string.length() )
        {
            return rhs_;
        }
        if( 0 == rhs_.m_string.length() )
        {
            return lhs_;
        }
        std::string strlhs = lhs_.m_string;
        while( strlhs.length() && strlhs.find_last_of( FILESYSTEMUTILS_SEPERATORS ) == strlhs.length()-1 )
        {
        	strlhs.erase(strlhs.length()-1, 1);
        }
        
        //note: should probably remove preceding seperators to rhs_, but this has not as yet occured
        Path join = strlhs + Path::seperator + rhs_.m_string;
        return join;
    }